

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void QGraphicsScenePrivate::updateTouchPointsForItem(QGraphicsItem *item,QTouchEvent *touchEvent)

{
  long *plVar1;
  long lVar2;
  qreal *pqVar3;
  QPointF *pQVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  undefined8 uVar6;
  undefined8 in_XMM1_Qa;
  QTransform mapFromScene;
  QPointF local_80 [5];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pqVar3 = (qreal *)&DAT_00702c58;
  pQVar4 = local_80;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    (*(qreal (*) [3])&pQVar4->xp)[0] = *pqVar3;
    pqVar3 = pqVar3 + 1;
    pQVar4 = (QPointF *)&pQVar4->yp;
  }
  QGraphicsItemPrivate::genericMapFromSceneTransform
            ((QTransform *)local_80,(item->d_ptr).d,*(QWidget **)(touchEvent + 0x40));
  if (*(long *)(touchEvent + 0x38) != 0) {
    uVar5 = 0;
    do {
      plVar1 = (long *)QPointerEvent::point((longlong)touchEvent);
      QEventPoint::scenePosition();
      uVar6 = QTransform::map(local_80);
      lVar2 = *plVar1;
      *(undefined8 *)(lVar2 + 0x30) = uVar6;
      *(undefined8 *)(lVar2 + 0x38) = in_XMM1_Qa;
      uVar5 = uVar5 + 1;
    } while (uVar5 < *(ulong *)(touchEvent + 0x38));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::updateTouchPointsForItem(QGraphicsItem *item, QTouchEvent *touchEvent)
{
    const QTransform mapFromScene =
        item->d_ptr->genericMapFromSceneTransform(static_cast<const QWidget *>(touchEvent->target()));

    for (int i = 0; i < touchEvent->pointCount(); ++i) {
        auto &pt = touchEvent->point(i);
        QMutableEventPoint::setPosition(pt, mapFromScene.map(pt.scenePosition()));
    }
}